

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool absl::lts_20240722::container_internal::operator==(iterator *a,iterator *b)

{
  ctrl_t cVar1;
  slot_type *psVar2;
  slot_type *psVar3;
  slot_type *psVar4;
  SCC *pSVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [12];
  undefined1 auVar15 [13];
  undefined1 auVar16 [14];
  slot_type *psVar17;
  slot_type *psVar18;
  reference ppVar19;
  ctrl_t *pcVar20;
  uint uVar21;
  bool bVar22;
  slot_type *psVar23;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  
  psVar2 = (slot_type *)a->ctrl_;
  if ((psVar2 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_ ||
       psVar2 == (slot_type *)0x0) || (-1 < (char)*(code *)psVar2)) {
    psVar3 = (slot_type *)b->ctrl_;
    if ((psVar3 != (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_ &&
         psVar3 != (slot_type *)0x0) && ((char)*(code *)psVar3 < '\0')) goto LAB_001eda4f;
    if (psVar2 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_ &&
        psVar3 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_) {
LAB_001eda42:
      return psVar2 == psVar3;
    }
    if ((psVar2 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_) !=
        (psVar3 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_))
    goto LAB_001eda54;
    if (psVar2 == (slot_type *)0x0 || psVar3 == (slot_type *)0x0) goto LAB_001eda42;
    if ((psVar3 == (slot_type *)&kSooControl) == (psVar2 == (slot_type *)&kSooControl)) {
      a = (iterator *)(a->field_1).slot_;
      psVar4 = (b->field_1).slot_;
      if (psVar2 == (slot_type *)&kSooControl) {
        bVar22 = (slot_type *)a == psVar4;
      }
      else {
        psVar23 = psVar4;
        psVar17 = psVar3;
        psVar18 = (slot_type *)a;
        if (psVar3 < psVar2) {
          psVar23 = (slot_type *)a;
          psVar17 = psVar2;
          psVar18 = psVar4;
        }
        bVar22 = psVar18 <= psVar23 && psVar17 < psVar18;
      }
      if (bVar22) goto LAB_001eda42;
    }
  }
  else {
    operator==();
LAB_001eda4f:
    operator==();
LAB_001eda54:
    operator==();
  }
  operator==();
  pSVar5 = ((value_type *)a)->first;
  if (pSVar5 == (SCC *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,absl::lts_20240722::flat_hash_set<google::protobuf::compiler::SCC_const*,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<google::protobuf::compiler::SCC_const*>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,absl::lts_20240722::flat_hash_set<google::protobuf::compiler::SCC_const*,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<google::protobuf::compiler::SCC_const*>>>>>
    ::iterator::operator->((iterator *)a);
  }
  else if (pSVar5 != (SCC *)google::protobuf::internal::TypeCardToString_abi_cxx11_) {
    if (-1 < (char)*(code *)&(pSVar5->descriptors).
                             super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) {
      ppVar19 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::flat_hash_set<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_absl::lts_20240722::flat_hash_set<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>_>_>_>
                ::iterator::operator*(a);
      return SUB81(ppVar19,0);
    }
    goto LAB_001eda8c;
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,absl::lts_20240722::flat_hash_set<google::protobuf::compiler::SCC_const*,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<google::protobuf::compiler::SCC_const*>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,absl::lts_20240722::flat_hash_set<google::protobuf::compiler::SCC_const*,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<google::protobuf::compiler::SCC_const*>>>>>
  ::iterator::operator->((iterator *)a);
LAB_001eda8c:
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,absl::lts_20240722::flat_hash_set<google::protobuf::compiler::SCC_const*,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<google::protobuf::compiler::SCC_const*>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,absl::lts_20240722::flat_hash_set<google::protobuf::compiler::SCC_const*,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<google::protobuf::compiler::SCC_const*>>>>>
  ::iterator::operator->((iterator *)a);
  if ((((value_type *)a)->second).
      super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::compiler::SCC_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
      .settings_.
      super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
      capacity_ < 2) {
    pcVar20 = (ctrl_t *)0x0;
  }
  else if (((value_type *)a)->first == (SCC *)0x1) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::compiler::SCC_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
    ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::compiler::SCC_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
                *)a);
    pcVar20 = (ctrl_t *)&kSooControl;
  }
  else {
    if (((value_type *)a)->first == (SCC *)0x0) {
      __assert_fail("!kEnabled || cap >= kCapacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xb37,
                    "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::compiler::SCC *>, absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Hash, absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Eq, std::allocator<const google::protobuf::compiler::SCC *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::compiler::SCC *>, Hash = absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Eq, Alloc = std::allocator<const google::protobuf::compiler::SCC *>]"
                   );
    }
    pcVar20 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::compiler::SCC_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
              ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::compiler::SCC_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
                         *)a);
    if (pcVar20 == (ctrl_t *)0x0) {
      __assert_fail("ctrl != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x9d0,
                    "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::compiler::SCC *>, absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Hash, absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Eq, std::allocator<const google::protobuf::compiler::SCC *>>::iterator::iterator(ctrl_t *, MaybeInitializedPtr, const GenerationType *) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::compiler::SCC *>, Hash = absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Eq, Alloc = std::allocator<const google::protobuf::compiler::SCC *>]"
                   );
    }
    cVar1 = *pcVar20;
    while (cVar1 < kSentinel) {
      iVar9 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                     CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar10 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                      CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar11 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                      CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar12 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar20 < (ctrl_t)iVar9);
      in_XMM1_Bb = -(pcVar20[1] < (ctrl_t)((uint)iVar9 >> 8));
      in_XMM1_Bc = -(pcVar20[2] < (ctrl_t)((uint)iVar9 >> 0x10));
      in_XMM1_Bd = -(pcVar20[3] < (ctrl_t)((uint)iVar9 >> 0x18));
      in_XMM1_Be = -(pcVar20[4] < (ctrl_t)iVar10);
      in_XMM1_Bf = -(pcVar20[5] < (ctrl_t)((uint)iVar10 >> 8));
      in_XMM1_Bg = -(pcVar20[6] < (ctrl_t)((uint)iVar10 >> 0x10));
      in_XMM1_Bh = -(pcVar20[7] < (ctrl_t)((uint)iVar10 >> 0x18));
      in_XMM1_Bi = -(pcVar20[8] < (ctrl_t)iVar11);
      in_XMM1_Bj = -(pcVar20[9] < (ctrl_t)((uint)iVar11 >> 8));
      in_XMM1_Bk = -(pcVar20[10] < (ctrl_t)((uint)iVar11 >> 0x10));
      in_XMM1_Bl = -(pcVar20[0xb] < (ctrl_t)((uint)iVar11 >> 0x18));
      in_XMM1_Bm = -(pcVar20[0xc] < (ctrl_t)iVar12);
      in_XMM1_Bn = -(pcVar20[0xd] < (ctrl_t)((uint)iVar12 >> 8));
      in_XMM1_Bo = -(pcVar20[0xe] < (ctrl_t)((uint)iVar12 >> 0x10));
      in_XMM1_Bp = -(pcVar20[0xf] < (ctrl_t)((uint)iVar12 >> 0x18));
      auVar7[1] = in_XMM1_Bb;
      auVar7[0] = in_XMM1_Ba;
      auVar7[2] = in_XMM1_Bc;
      auVar7[3] = in_XMM1_Bd;
      auVar7[4] = in_XMM1_Be;
      auVar7[5] = in_XMM1_Bf;
      auVar7[6] = in_XMM1_Bg;
      auVar7[7] = in_XMM1_Bh;
      auVar7[8] = in_XMM1_Bi;
      auVar7[9] = in_XMM1_Bj;
      auVar7[10] = in_XMM1_Bk;
      auVar7[0xb] = in_XMM1_Bl;
      auVar7[0xc] = in_XMM1_Bm;
      auVar7[0xd] = in_XMM1_Bn;
      auVar7[0xe] = in_XMM1_Bo;
      auVar7[0xf] = in_XMM1_Bp;
      auVar8[1] = in_XMM1_Bb;
      auVar8[0] = in_XMM1_Ba;
      auVar8[2] = in_XMM1_Bc;
      auVar8[3] = in_XMM1_Bd;
      auVar8[4] = in_XMM1_Be;
      auVar8[5] = in_XMM1_Bf;
      auVar8[6] = in_XMM1_Bg;
      auVar8[7] = in_XMM1_Bh;
      auVar8[8] = in_XMM1_Bi;
      auVar8[9] = in_XMM1_Bj;
      auVar8[10] = in_XMM1_Bk;
      auVar8[0xb] = in_XMM1_Bl;
      auVar8[0xc] = in_XMM1_Bm;
      auVar8[0xd] = in_XMM1_Bn;
      auVar8[0xe] = in_XMM1_Bo;
      auVar8[0xf] = in_XMM1_Bp;
      auVar16[1] = in_XMM1_Bd;
      auVar16[0] = in_XMM1_Bc;
      auVar16[2] = in_XMM1_Be;
      auVar16[3] = in_XMM1_Bf;
      auVar16[4] = in_XMM1_Bg;
      auVar16[5] = in_XMM1_Bh;
      auVar16[6] = in_XMM1_Bi;
      auVar16[7] = in_XMM1_Bj;
      auVar16[8] = in_XMM1_Bk;
      auVar16[9] = in_XMM1_Bl;
      auVar16[10] = in_XMM1_Bm;
      auVar16[0xb] = in_XMM1_Bn;
      auVar16[0xc] = in_XMM1_Bo;
      auVar16[0xd] = in_XMM1_Bp;
      auVar15[1] = in_XMM1_Be;
      auVar15[0] = in_XMM1_Bd;
      auVar15[2] = in_XMM1_Bf;
      auVar15[3] = in_XMM1_Bg;
      auVar15[4] = in_XMM1_Bh;
      auVar15[5] = in_XMM1_Bi;
      auVar15[6] = in_XMM1_Bj;
      auVar15[7] = in_XMM1_Bk;
      auVar15[8] = in_XMM1_Bl;
      auVar15[9] = in_XMM1_Bm;
      auVar15[10] = in_XMM1_Bn;
      auVar15[0xb] = in_XMM1_Bo;
      auVar15[0xc] = in_XMM1_Bp;
      auVar14[1] = in_XMM1_Bf;
      auVar14[0] = in_XMM1_Be;
      auVar14[2] = in_XMM1_Bg;
      auVar14[3] = in_XMM1_Bh;
      auVar14[4] = in_XMM1_Bi;
      auVar14[5] = in_XMM1_Bj;
      auVar14[6] = in_XMM1_Bk;
      auVar14[7] = in_XMM1_Bl;
      auVar14[8] = in_XMM1_Bm;
      auVar14[9] = in_XMM1_Bn;
      auVar14[10] = in_XMM1_Bo;
      auVar14[0xb] = in_XMM1_Bp;
      auVar13[1] = in_XMM1_Bg;
      auVar13[0] = in_XMM1_Bf;
      auVar13[2] = in_XMM1_Bh;
      auVar13[3] = in_XMM1_Bi;
      auVar13[4] = in_XMM1_Bj;
      auVar13[5] = in_XMM1_Bk;
      auVar13[6] = in_XMM1_Bl;
      auVar13[7] = in_XMM1_Bm;
      auVar13[8] = in_XMM1_Bn;
      auVar13[9] = in_XMM1_Bo;
      auVar13[10] = in_XMM1_Bp;
      uVar21 = (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar16 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar15 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar14 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar13 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar6 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      cVar1 = pcVar20[uVar6];
      pcVar20 = pcVar20 + uVar6;
    }
    if (*pcVar20 < ~kSentinel) {
      __assert_fail("IsFull(*it.control())",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xb1e,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::compiler::SCC *>, absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Hash, absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Eq, std::allocator<const google::protobuf::compiler::SCC *>>::begin() [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::compiler::SCC *>, Hash = absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Eq, Alloc = std::allocator<const google::protobuf::compiler::SCC *>]"
                   );
    }
  }
  return SUB81(pcVar20,0);
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }